

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::writeSection
          (SonarQubeReporter *this,string *rootName,SectionNode *sectionNode,bool okToFail)

{
  XmlWriter *this_00;
  pointer puVar1;
  bool bVar2;
  SectionNode *sectionNode_00;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  pointer this_01;
  StringRef name_00;
  StringRef name_01;
  allocator<char> local_89;
  string name;
  ScopedElement e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  trim(&name,(string *)sectionNode);
  if (rootName->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,rootName,
                   '/');
    std::operator+(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                   ,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&e);
  }
  bVar2 = CumulativeReporterBase::SectionNode::hasAnyAssertions(sectionNode);
  if (((bVar2) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testCase",&local_89);
    this_00 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    name_00.m_size = 4;
    name_00.m_start = "name";
    XmlWriter::writeAttribute(this_00,name_00,(StringRef)name._0_16_);
    local_48._M_dataplus._M_p = (pointer)(long)((sectionNode->stats).durationInSeconds * 1000.0);
    name_01.m_size = 8;
    name_01.m_start = "duration";
    XmlWriter::writeAttribute<long,void>(this_00,name_01,(long *)&local_48);
    writeAssertions(this,sectionNode,okToFail);
    XmlWriter::ScopedElement::~ScopedElement(&e);
  }
  puVar1 = (sectionNode->childSections).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (sectionNode->childSections).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1; this_01 = this_01 + 1
      ) {
    sectionNode_00 =
         Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_01);
    writeSection(this,&name,sectionNode_00,okToFail);
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SonarQubeReporter::writeSection(std::string const& rootName, SectionNode const& sectionNode, bool okToFail) {
        std::string name = trim(sectionNode.stats.sectionInfo.name);
        if (!rootName.empty())
            name = rootName + '/' + name;

        if ( sectionNode.hasAnyAssertions()
            || !sectionNode.stdOut.empty()
            ||  !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement("testCase");
            xml.writeAttribute("name"_sr, name);
            xml.writeAttribute("duration"_sr, static_cast<long>(sectionNode.stats.durationInSeconds * 1000));

            writeAssertions(sectionNode, okToFail);
        }

        for (auto const& childNode : sectionNode.childSections)
            writeSection(name, *childNode, okToFail);
    }